

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O2

void __thiscall HoldingMovableType::HoldingMovableType(HoldingMovableType *this)

{
  int iVar1;
  
  LOCK();
  UNLOCK();
  iVar1 = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (this->value1).super_PropertyHoldingBase<Movable>.m_value.m_id = iVar1;
  LOCK();
  UNLOCK();
  iVar1 = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (this->value2).super_PropertyHoldingBase<Movable>.m_value.m_id = iVar1;
  LOCK();
  UNLOCK();
  iVar1 = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (this->ro_value).super_PropertyHoldingBase<Movable>.m_value.m_id = iVar1;
  LOCK();
  UNLOCK();
  iVar1 = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (this->value3).super_PropertyHoldingBase<IdHolder>.m_value.id = iVar1;
  LOCK();
  UNLOCK();
  iVar1 = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (this->ro_value2).super_PropertyHoldingBase<IdHolder>.m_value.id = iVar1;
  return;
}

Assistant:

HoldingMovableType() = default;